

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_1.cpp
# Opt level: O1

float read_int(istream *is)

{
  runtime_error *this;
  long *plVar1;
  long *plVar2;
  float num;
  string line;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::istream::_M_extract<float>((float *)is);
  if ((char)((*(uint *)(is + *(long *)(*(long *)is + -0x18) + 0x20) & 2) >> 1) != '\0' ||
      (*(uint *)(is + *(long *)(*(long *)is + -0x18) + 0x20) & 5) == 0) {
    return 0.0;
  }
  std::ios::clear((int)*(long *)(*(long *)is + -0x18) + (int)is);
  std::istream::unget();
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  std::getline<char,std::char_traits<char>,std::allocator<char>>(is,(string *)&local_68);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_48,"\'",&local_68);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_48);
  local_88 = (long *)*plVar1;
  plVar2 = plVar1 + 2;
  if (local_88 == plVar2) {
    local_78 = *plVar2;
    lStack_70 = plVar1[3];
    local_88 = &local_78;
  }
  else {
    local_78 = *plVar2;
  }
  local_80 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::runtime_error::runtime_error(this,(string *)&local_88);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

float read_int(std::istream& is)
{
	float num{ 0 };
	is >> num;
	if (!is)
	{
		if (!is.eof())
		{
			is.clear();
			is.unget();
			std::string line;
			std::getline(is, line);
			throw std::runtime_error("'" + line + "' is not a valid number.");
		}
	}
	return num;
}